

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O2

const_iterator __thiscall apngasm_cli::Options::inputFilesEnd_abi_cxx11_(Options *this)

{
  int iVar1;
  size_type sVar2;
  any *operand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  pointer pbVar4;
  allocator<char> local_4a;
  allocator<char> local_49;
  key_type local_48;
  string local_28 [32];
  
  if ((inputFilesEnd[abi:cxx11]()::empty_vector_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&inputFilesEnd[abi:cxx11]()::empty_vector_abi_cxx11_), iVar1 != 0)
     ) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&inputFilesEnd[abi:cxx11]()::empty_vector_abi_cxx11_,0,(allocator_type *)&local_48);
    __cxa_atexit(std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~vector,&inputFilesEnd[abi:cxx11]()::empty_vector_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&inputFilesEnd[abi:cxx11]()::empty_vector_abi_cxx11_);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"files",&local_49);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)&this->field_0x28,&local_48);
  pbVar4 = inputFilesEnd[abi:cxx11]()::empty_vector_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (sVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>(local_28,"files",&local_4a);
    operand = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&this->vm)
    ;
    pvVar3 = boost::
             any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                       (operand);
    pbVar4 = (pvVar3->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::~string(local_28);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return (const_iterator)pbVar4;
}

Assistant:

const std::vector<std::string>::const_iterator
Options::inputFilesEnd(void) const {
  static std::vector<std::string> empty_vector(0);
  return (vm.count("files") ? vm["files"].as<std::vector<std::string>>().end()
                            : empty_vector.end());
}